

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls.c
# Opt level: O0

void al_set_fs_interface(ALLEGRO_FS_INTERFACE *fs_interface)

{
  thread_local_state *ptVar1;
  ALLEGRO_FS_INTERFACE *in_RDI;
  thread_local_state *tls;
  
  ptVar1 = tls_get();
  if (ptVar1 != (thread_local_state *)0x0) {
    ptVar1->fs_interface = in_RDI;
  }
  return;
}

Assistant:

void al_set_fs_interface(const ALLEGRO_FS_INTERFACE *fs_interface)
{
   thread_local_state *tls;

   if ((tls = tls_get()) == NULL)
      return;
   tls->fs_interface = fs_interface;
}